

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::SdfAnnotateTask::checkArguments
          (SdfAnnotateTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Type *pTVar4;
  long lVar5;
  ulong uVar6;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,1,7);
  pTVar4 = (Type *)CONCAT71(extraout_var,bVar2);
  lVar5 = 400;
  if (bVar2) {
    bVar2 = (args->_M_extent)._M_extent_value != 0;
    if (bVar2) {
      uVar6 = 0;
      do {
        if (uVar6 != 1) {
          bVar3 = Type::canBeStringLike(((*args->_M_ptr)->type).ptr);
          pTVar4 = (Type *)CONCAT71(extraout_var_00,bVar3);
          if (!bVar3) {
            pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this,context,args->_M_ptr[uVar6]);
            break;
          }
        }
        uVar6 = uVar6 + 1;
        bVar2 = uVar6 < (args->_M_extent)._M_extent_value;
      } while (bVar2);
    }
    lVar5 = 0x188;
    if (bVar2) {
      return pTVar4;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar5);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 7))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            if (i != 1 && !args[0]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }